

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O0

void __thiscall
client::
mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::mini_xml_grammar(mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *tuple;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar1;
  proto_child0 a1;
  actor<boost::spirit::attribute<0>_> *tuple_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0;
  expr<_2ed517bd_> *expr;
  phoenix *ppVar2;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  local_2a2a;
  type local_2a28;
  undefined1 local_2a0e [6];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_2a08;
  proto_child0 local_2a00;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_29f8 [2];
  undefined1 local_29e5 [2];
  undefined1 local_29e3 [11];
  proto_child0 local_29d8;
  expr<_8624afe9_> local_29d0;
  expr<_2fed91a4_> local_29c0;
  char local_29a9;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:146:31)_&>,_0L>_>,_2L>
  local_29a8;
  char local_2991;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:145:36)_&>,_0L>_>,_2L>
  local_2990;
  char local_2979;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:145:36)_&>,_0L>_>,_2L>_&>,_2L>
  local_2978;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:145:36)_&>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2968;
  expr<_2b9e738c_> local_2958;
  expr<_782e6df1_> local_2948;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:144:43)_&>,_0L>_>,_2L>
  local_2940;
  expr<_1b2970d8_> local_2930;
  expr<_2ed517bd_> local_2920;
  char local_290f [4];
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>_>,_boost::phoenix::actor<boost::spirit::attribute<1>_>_>,_2L>_>,_1>_>,_0L>
  local_290b;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>_>,_boost::phoenix::actor<boost::spirit::attribute<1>_>_>,_2L>_>,_1>_>,_0L>_&>,_2L>
  local_2908;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>_>,_boost::phoenix::actor<boost::spirit::attribute<1>_>_>,_2L>_>,_1>_>,_0L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_28f8;
  undefined1 local_28e6 [3];
  undefined1 local_28e3 [2];
  undefined1 local_28e1;
  undefined1 *local_28e0;
  undefined1 *local_28d8;
  undefined1 **local_28d0;
  undefined1 *local_28c8;
  undefined1 local_28c0 [8];
  undefined1 *local_28b8;
  mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28b0;
  bool_<false> local_28a3;
  terminal<boost::spirit::tag::lit> local_28a2 [2];
  undefined8 local_28a0;
  undefined1 local_2891;
  undefined1 *local_2890;
  undefined8 *local_2888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2880;
  undefined1 local_2870 [18];
  char local_285e [3];
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  local_285b;
  char local_2859;
  expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2858;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_2848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_2828;
  undefined1 local_2819;
  type local_2818;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2808;
  undefined1 *local_2800;
  undefined1 local_27f8 [16];
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[5]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_27e8;
  char local_27d6 [3];
  undefined1 local_27d3 [2];
  undefined1 local_27d1;
  undefined1 local_27d0 [16];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_27c0;
  undefined1 *local_27b8;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  *local_27b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_27a8;
  char local_2791;
  type local_2790;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2780;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>
  local_2770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2760;
  char local_274e [3];
  undefined1 local_274b [2];
  undefined1 local_2749;
  function_buffer local_2748;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2730;
  char *local_2728;
  undefined1 *local_2720;
  undefined1 local_2718 [16];
  type local_2708;
  undefined1 local_26f1;
  undefined8 local_26f0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_26e8;
  undefined8 *local_26e0;
  undefined8 **local_26d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_26d0;
  vtable_base *local_26c0;
  undefined1 local_26b8 [24];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_26a0;
  undefined1 local_2692 [2];
  undefined1 local_2690 [16];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_2680;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  local_266b;
  undefined1 local_2669;
  undefined1 local_2668 [16];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_2658;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>
  local_2648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2640;
  car_type local_262c;
  undefined1 local_262b [2];
  allocator<char> local_2629;
  undefined1 local_2628 [4];
  car_type when_print;
  car_type switch_to_print;
  car_type transitions_from_print;
  allocator<char> local_2601;
  string local_2600;
  allocator<char> local_25d9;
  string local_25d8;
  allocator<char> local_25b1;
  string local_25b0;
  allocator<char> local_2589;
  string local_2588;
  allocator<char> local_2561;
  string local_2560;
  allocator<char> local_2539;
  string local_2538;
  allocator<char> local_2511;
  string local_2510;
  allocator<char> local_24e9;
  string local_24e8;
  allocator<char> local_24b1;
  string local_24b0;
  mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2490;
  mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  undefined1 *local_2480;
  undefined1 *local_2478;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
  that_61;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
  that_48;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
  that_36;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
  that_24;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
  that_6;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_59;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_46;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_34;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_22;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_4;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  that_11;
  undefined1 local_2118 [8];
  that_type that_8;
  undefined1 local_1e19;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_1e18;
  that_type that_69;
  undefined1 local_1d49;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_1d48;
  that_type that_71;
  that_type that_77;
  undefined1 local_1c79;
  actor<boost::spirit::attribute<0>_> *paStack_1c78;
  that_type that_87;
  undefined1 *local_1c38;
  that_type that_84;
  undefined1 local_1bf9;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_1bf8;
  that_type that_88;
  undefined1 local_1bb9;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>
  *local_1bb8;
  undefined1 local_1ba9;
  char **local_1ba8;
  undefined1 local_1b99;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  **local_1b98;
  undefined1 local_1b89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_1b88;
  undefined1 local_1b79;
  mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b78;
  mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b70;
  undefined1 *local_1b68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_1b60;
  undefined1 *local_1b58;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  **local_1b50;
  undefined1 *local_1b48;
  char **local_1b40;
  undefined1 *local_1b38;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>
  *local_1b30;
  undefined1 *local_1b28;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_1b18;
  expr_type that_5;
  expr_type that_23;
  expr_type that_35;
  expr_type that_47;
  expr_type that_60;
  expr_type that;
  expr_type that_12;
  expr_type that_18;
  expr_type that_30;
  expr_type that_42;
  expr_type that_55;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_56;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_43;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_31;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_19;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_13;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_1;
  undefined1 local_15a9;
  proto_child0 local_15a8;
  undefined1 local_1599;
  undefined1 *local_1598;
  undefined1 local_1589;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  *local_1588;
  undefined1 local_1579;
  undefined1 *local_1578;
  undefined1 *local_1570;
  undefined1 *local_1568;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  *local_1560;
  undefined1 *local_1558;
  undefined1 *local_1550;
  undefined1 *local_1548;
  proto_child0 local_1540;
  undefined1 *local_1538;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  *local_1530;
  undefined1 *local_1528;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_151a;
  undefined1 *puStack_1518;
  expr_type that_2;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_14fa;
  undefined1 *puStack_14f8;
  expr_type that_20;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_14da;
  undefined1 *puStack_14d8;
  expr_type that_32;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_14ba;
  undefined1 *puStack_14b8;
  expr_type that_44;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_149a;
  undefined1 *puStack_1498;
  expr_type that_57;
  undefined1 local_1396;
  empty_env local_1395;
  int local_1394;
  empty_env d_5;
  expr_param pbStack_1390;
  empty_state s_5;
  undefined1 local_137e;
  empty_env local_137d;
  int local_137c;
  empty_env d_4;
  expr_param pbStack_1378;
  empty_state s_4;
  undefined1 local_1366;
  empty_env local_1365;
  int local_1364;
  empty_env d_3;
  expr_param pbStack_1360;
  empty_state s_3;
  undefined1 local_134e;
  empty_env local_134d;
  int local_134c;
  empty_env d_2;
  expr_param pbStack_1348;
  empty_state s_2;
  undefined1 local_1336;
  empty_env local_1335;
  int local_1334;
  empty_env d;
  expr_param pbStack_1330;
  empty_state s;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_131a [2];
  data_param local_1318;
  state_param local_1310;
  expr_param local_1308;
  undefined1 *local_1300;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_12f2 [2];
  data_param local_12f0;
  state_param local_12e8;
  expr_param local_12e0;
  undefined1 *local_12d8;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_12ca [2];
  data_param local_12c8;
  state_param local_12c0;
  expr_param local_12b8;
  undefined1 *local_12b0;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_12a2 [2];
  data_param local_12a0;
  state_param local_1298;
  expr_param local_1290;
  undefined1 *local_1288;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_127a;
  undefined1 local_1279;
  data_param local_1278;
  state_param local_1270;
  expr_param local_1268;
  undefined1 *local_1260;
  expr_param local_1258;
  undefined1 *local_1250;
  basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_1242;
  expr_param pbStack_1240;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_58;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_45;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_33;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_21;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_3;
  expr_type that_7;
  undefined1 local_1141;
  vtable_base *local_1140;
  vtable_base *local_1138;
  undefined1 *local_1130;
  undefined1 local_1121;
  undefined1 *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  undefined1 local_1102;
  undefined1 local_1101;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  undefined1 *local_10f0;
  undefined1 local_10e7;
  undefined1 local_10e6;
  empty_env local_10e5;
  int local_10e4;
  empty_env d_1;
  expr_param pbStack_10e0;
  empty_state s_1;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::spirit::attribute<0>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_10ca;
  undefined1 local_10c9;
  data_param local_10c8;
  state_param local_10c0;
  expr_param local_10b8;
  undefined1 *local_10b0;
  undefined1 local_10a3 [2];
  undefined1 local_10a1;
  expr_param local_10a0;
  undefined1 *local_1098;
  expr_param local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  expr_param pbStack_1070;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_10;
  type that_9;
  expr_type that_26;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_27;
  expr_type that_25;
  expr_type that_16;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_17;
  expr_type that_15;
  expr_type that_14;
  expr_type that_38;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_39;
  expr_type that_37;
  expr_type that_28;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_29;
  expr_type that_50;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_51;
  expr_type that_49;
  expr_type that_40;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_41;
  expr_type that_63;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_64;
  expr_type that_62;
  expr_type that_53;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_54;
  expr_type that_52;
  expr_type that_67;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_68;
  expr_type that_65;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_66;
  expr_type that_82;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_83;
  expr_type that_81;
  undefined1 local_589;
  proto_child0 local_588;
  proto_child0 local_580;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_578;
  undefined1 *local_570;
  proto_child0 local_568;
  undefined1 *local_560;
  proto_child0 local_558;
  proto_child0 local_550;
  proto_child0 local_548;
  undefined8 local_540;
  undefined8 local_538;
  proto_child0 local_530;
  proto_child0 local_528;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:144:43)_&>,_0L>
  that_70;
  expr_type that_80;
  expr_type that_79;
  expr_type that_75;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_76;
  expr_type that_73;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_74;
  undefined1 local_301;
  proto_child0 local_300;
  proto_child0 local_2f8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_2f0;
  undefined1 *local_2e8;
  proto_child0 local_2e0;
  undefined1 *local_2d8;
  proto_child0 local_2d0;
  proto_child0 local_2c8;
  proto_child0 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  proto_child0 local_2a8;
  proto_child0 local_2a0;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:145:36)_&>,_0L>
  that_72;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mlutken[P]nestle_estl_fsm_playground_spirit2_playground_cpp:146:31)_&>,_0L>
  that_78;
  expr_type that_91;
  expr_type that_90;
  undefined1 local_139;
  proto_child0 local_138;
  actor<boost::spirit::attribute<0>_> **local_130;
  undefined1 *local_128;
  proto_child0 local_120;
  undefined1 *local_118;
  undefined1 local_10e;
  empty_env local_10d;
  int local_10c;
  empty_env d_6;
  phoenix *ppStack_108;
  empty_state s_6;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_f2;
  undefined1 local_f1;
  data_param local_f0;
  state_param local_e8;
  phoenix *local_e0;
  undefined1 *local_d8;
  undefined1 local_cc [3];
  undefined1 local_c9;
  expr_param local_c8;
  undefined1 *local_c0;
  expr_param local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  expr_param pbStack_98;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_86;
  type that_85;
  expr_type that_89;
  undefined1 local_31;
  proto_child0 local_30;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_28;
  undefined1 *local_20;
  proto_child0 local_18;
  undefined1 *local_10;
  
  local_2490 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24b0,"unnamed-grammar",&local_24b1);
  boost::spirit::qi::
  grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->xml,&local_24b0);
  std::__cxx11::string::~string((string *)&local_24b0);
  std::allocator<char>::~allocator(&local_24b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24e8,"unnamed-rule",&local_24e9);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->xml,&local_24e8);
  std::__cxx11::string::~string((string *)&local_24e8);
  std::allocator<char>::~allocator(&local_24e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2510,"unnamed-rule",&local_2511);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->node,&local_2510);
  std::__cxx11::string::~string((string *)&local_2510);
  std::allocator<char>::~allocator(&local_2511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2538,"unnamed-rule",&local_2539);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->text,&local_2538);
  std::__cxx11::string::~string((string *)&local_2538);
  std::allocator<char>::~allocator(&local_2539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2560,"unnamed-rule",&local_2561);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->start_tag,&local_2560);
  std::__cxx11::string::~string((string *)&local_2560);
  std::allocator<char>::~allocator(&local_2561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2588,"unnamed-rule",&local_2589);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->end_tag,&local_2588);
  std::__cxx11::string::~string((string *)&local_2588);
  std::allocator<char>::~allocator(&local_2589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25b0,"unnamed-rule",&local_25b1);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->transitions_declaration,&local_25b0);
  std::__cxx11::string::~string((string *)&local_25b0);
  std::allocator<char>::~allocator(&local_25b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25d8,"unnamed-rule",&local_25d9);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->transitions_from,&local_25d8);
  std::__cxx11::string::~string((string *)&local_25d8);
  std::allocator<char>::~allocator(&local_25d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2600,"unnamed-rule",&local_2601);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->switch_to,&local_2600);
  std::__cxx11::string::~string((string *)&local_2600);
  std::allocator<char>::~allocator(&local_2601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2628,"unnamed-rule",&local_2629);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->when,(string *)local_2628);
  std::__cxx11::string::~string((string *)local_2628);
  std::allocator<char>::~allocator(&local_2629);
  local_2669 = '<';
  local_2668._8_8_ = &local_2669;
  local_2668._0_8_ = &boost::spirit::ascii::char_;
  puStack_1518 = &boost::spirit::_1;
  pbStack_1330 = &local_151a;
  local_1334 = 0;
  local_1300 = &local_1336;
  local_1310 = &local_1334;
  local_1318 = &local_1335;
  local_1308 = pbStack_1330;
  boost::proto::_::
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  ::operator()(local_131a,pbStack_1330,local_1310,local_1318);
  local_2658.child0 = (proto_child0)local_2668;
  local_2658.child1 = &local_266b;
  local_1528 = (undefined1 *)((long)&that_1.child0 + 7);
  local_2648.child0 = &local_2658;
  local_2640._8_8_ = &local_2648;
  local_1b28 = &local_1bb9;
  local_2640._M_allocated_capacity = (size_type)&boost::spirit::lexeme;
  local_1bb8 = (expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>
                *)local_2640._8_8_;
  local_1b30 = (expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>
                *)local_2640._8_8_;
  local_1b18 = local_2648.child0;
  that_5.child0 = local_2648.child0;
  local_1530 = local_2658.child1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->text,
              (expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>
               *)&local_2640);
  local_2690._0_8_ = &this->xml;
  local_2690._8_8_ = &this->text;
  that_8._8_8_ = &boost::spirit::_1;
  local_2118 = (undefined1  [8])&boost::spirit::_val;
  local_1100 = &boost::spirit::_1;
  local_10f0 = &local_1101;
  local_10f8 = &boost::spirit::_1;
  local_10e7 = 0;
  pbStack_10e0 = (expr_param)local_2118;
  local_10e4 = 0;
  local_10b0 = &local_10e6;
  local_10c0 = &local_10e4;
  local_10c8 = &local_10e5;
  local_10b8 = pbStack_10e0;
  local_10a0 = boost::proto::_::
               impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::spirit::attribute<0>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
               ::operator()(&local_10ca,pbStack_10e0,local_10c0,local_10c8);
  local_1098 = &local_10c9;
  local_1080 = &local_10a1;
  local_1088 = local_10a3;
  local_2680.child0 = (proto_child0)local_2690;
  local_2680.child1 = (proto_child1)local_2692;
  local_1130 = &local_1141;
  local_1140 = (vtable_base *)local_2680.child1;
  local_1138 = (vtable_base *)local_2680.child1;
  local_1090 = local_10a0;
  pbStack_1070 = local_10a0;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->node,&local_2680);
  local_26f1 = 't';
  local_26e8.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_26f1;
  local_26f0 = &boost::spirit::ascii::char_;
  local_26e0 = &local_26f0;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_2708,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [17])"transitions_from",(is_false)0x0);
  local_26d8 = &local_26e0;
  local_26d0._M_allocated_capacity = (size_type)&local_2708;
  local_2718[0xf] = '(';
  local_26d0._8_8_ = &local_26d8;
  local_26c0 = (vtable_base *)(local_2718 + 0xf);
  local_2749 = 0x29;
  local_2748._8_8_ = &local_2749;
  local_2748.members.obj_ptr = &boost::spirit::ascii::char_;
  puStack_14f8 = &boost::spirit::_1;
  pbStack_1348 = &local_14fa;
  local_134c = 0;
  local_12d8 = &local_134e;
  local_12e8 = &local_134c;
  local_12f0 = &local_134d;
  local_12e0 = pbStack_1348;
  boost::proto::_::
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  ::operator()(local_12f2,pbStack_1348,local_12e8,local_12f0);
  local_2748._16_8_ = &local_2748;
  local_2730.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )local_274b;
  local_1538 = &local_15a9;
  local_2728 = local_2748.data + 0x10;
  local_2718._0_8_ = &local_2728;
  local_1b38 = &local_1ba9;
  local_2720 = &boost::spirit::lexeme;
  local_26b8._0_8_ = local_26d0._M_local_buf + 8;
  local_26b8._8_8_ = &local_2720;
  local_274e[0] = ')';
  local_26b8._16_8_ = local_26b8;
  local_26a0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )local_274e;
  local_1ba8 = (char **)local_2718._0_8_;
  local_1b40 = (char **)local_2718._0_8_;
  local_15a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_2730.proto_expr_.child0.ref.t_;
  local_1540.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_2730.proto_expr_.child0.ref.t_;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->transitions_from,(expr<_5102aff_> *)(local_26b8 + 0x10));
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_2790,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [10])"switch_to",(is_false)0x0);
  local_2791 = '(';
  local_2780.child0 = &local_2790;
  local_2780.child1.child0 = &local_2791;
  local_27d1 = ')';
  local_27d0._8_8_ = &local_27d1;
  local_27d0._0_8_ = &boost::spirit::ascii::char_;
  puStack_14d8 = &boost::spirit::_1;
  pbStack_1360 = &local_14da;
  local_1364 = 0;
  local_12b0 = &local_1366;
  local_12c0 = &local_1364;
  local_12c8 = &local_1365;
  local_12b8 = pbStack_1360;
  boost::proto::_::
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  ::operator()(local_12ca,pbStack_1360,local_12c0,local_12c8);
  local_27c0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )local_27d0;
  local_27b8 = local_27d3;
  local_1548 = &local_1599;
  local_27b0 = &local_27c0;
  local_27a8._8_8_ = &local_27b0;
  local_1b48 = &local_1b99;
  local_27a8._M_allocated_capacity = (size_type)&boost::spirit::lexeme;
  local_2770.child0 = &local_2780;
  local_2770.child1 = (proto_child1)&local_27a8;
  local_27d6[0] = ')';
  local_2760._M_allocated_capacity = (size_type)&local_2770;
  local_2760._8_8_ = local_27d6;
  local_1b98 = (extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                **)local_27a8._8_8_;
  local_1b50 = (extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                **)local_27a8._8_8_;
  local_1598 = local_27b8;
  local_1550 = local_27b8;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->switch_to,
              (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
               *)&local_2760);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_2818,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [5])"when",(is_false)0x0);
  local_2819 = '(';
  local_2808.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_2818;
  local_2800 = &local_2819;
  local_2859 = ')';
  local_2858.child1.child0 = &local_2859;
  local_2858.child0 = (proto_child0)&boost::spirit::ascii::char_;
  puStack_14b8 = &boost::spirit::_1;
  pbStack_1378 = &local_14ba;
  local_137c = 0;
  local_1288 = &local_137e;
  local_1298 = &local_137c;
  local_12a0 = &local_137d;
  local_1290 = pbStack_1378;
  pbStack_1240 = boost::proto::_::
                 impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
                 ::operator()(local_12a2,pbStack_1378,local_1298,local_12a0);
  local_2848.child0 = &local_2858;
  local_2848.child1 = &local_285b;
  local_1558 = &local_1589;
  local_2838._M_allocated_capacity = (size_type)&local_2848;
  local_2828 = &local_2838;
  local_1b58 = &local_1b89;
  local_2838._8_8_ = &boost::spirit::lexeme;
  local_27f8._0_8_ = &local_2808;
  local_27f8._8_8_ = local_2838._M_local_buf + 8;
  local_285e[0] = ')';
  local_27e8.child0 = (proto_child0)local_27f8;
  local_27e8.child1.child0 = local_285e;
  that_61.child1 = (proto_child1)local_2828;
  local_1b88 = local_2828;
  local_1b60 = local_2828;
  local_1588 = local_2848.child1;
  local_1560 = local_2848.child1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->when,&local_27e8);
  local_2891 = 0x3c;
  local_28a3 = (bool_<false>)0x2f;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_28a2,&boost::spirit::lit,&local_28a3);
  local_28a0 = local_28a2;
  local_2890 = &local_2891;
  local_2888 = &local_28a0;
  local_28e1 = 0x3e;
  local_28d8 = &local_28e1;
  local_28e0 = &boost::spirit::ascii::char_;
  puStack_1498 = &boost::spirit::_1;
  pbStack_1390 = &local_149a;
  local_1394 = 0;
  local_1260 = &local_1396;
  local_1270 = &local_1394;
  local_1278 = &local_1395;
  local_1268 = pbStack_1390;
  local_1258 = boost::proto::_::
               impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
               ::operator()(&local_127a,pbStack_1390,local_1270,local_1278);
  local_1250 = &local_1279;
  local_1242 = *local_1258;
  local_28d0 = &local_28e0;
  local_28c8 = local_28e3;
  local_1568 = &local_1579;
  local_28c0 = (undefined1  [8])&local_28d0;
  local_2480 = &boost::spirit::lexeme;
  local_28b0 = (mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28c0;
  local_2478 = &boost::spirit::lexeme;
  local_1b68 = &local_1b79;
  local_28b8 = &boost::spirit::lexeme;
  local_2880._M_allocated_capacity = (size_type)&local_2890;
  local_2880._8_8_ = &local_28b8;
  local_28e6[0] = 0x3e;
  paVar1 = &local_2880;
  local_2870._8_8_ = local_28e6;
  local_2870._0_8_ = paVar1;
  this_local = local_28b0;
  local_1b78 = local_28b0;
  local_1b70 = local_28b0;
  local_1578 = local_28c8;
  local_1570 = local_28c8;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->start_tag,
              (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
               *)local_2870);
  boost::spirit::
  terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::ascii>>
  ::operator()((type *)&boost::spirit::ascii::string,&boost::spirit::_r1,
               (actor<boost::spirit::attribute<1>_> *)0x0,(is_true)paVar1->_M_local_buf);
  local_2908.child1 = &local_290b;
  local_2908.child0.child0 = (proto_child0)0x1334eb;
  local_290f[0] = '>';
  local_28f8.child0 = &local_2908;
  local_28f8.child1.child0 = local_290f;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void(std::__cxx11::string),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void(std::__cxx11::string),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->end_tag,&local_28f8);
  local_2940.child0 = &this->transitions_from;
  local_2940.child1.child0 = (proto_child0)(local_262b + 1);
  local_560 = &local_589;
  local_538 = 0;
  local_540 = 0;
  local_570 = &local_1e19;
  local_578 = &prStack_1e18;
  local_2979 = '.';
  local_2990.child0 = &this->switch_to;
  local_2990.child1.child0 = (proto_child0)local_262b;
  local_2d8 = &local_301;
  local_2b0 = 0;
  local_2b8 = 0;
  local_2e8 = &local_1d49;
  local_2f0 = &prStack_1d48;
  local_2978.child0.child0 = &local_2979;
  local_2978.child1 = &local_2990;
  local_2991 = '.';
  local_2968.child0 = &local_2978;
  local_2968.child1.child0 = &local_2991;
  local_29a8.child0 = &this->when;
  local_29a8.child1.child0 = &local_262c;
  local_2958.child0 = &local_2968;
  local_2958.child1 = &local_29a8;
  local_2948.child0 = &local_2958;
  local_2930.child0 = &local_2940;
  local_2930.child1 = &local_2948;
  local_29a9 = ';';
  local_2920.child0 = &local_2930;
  local_2920.child1.child0 = &local_29a9;
  expr = &local_2920;
  prStack_1e18 = local_2940.child0;
  that_69.child1.child0 = local_2940.child1.child0;
  prStack_1d48 = local_2990.child0;
  that_71.child1.child0 = local_2990.child1.child0;
  local_588 = (proto_child0)local_2940.child1.child0;
  local_580 = (proto_child0)local_2940.child1.child0;
  local_568 = (proto_child0)local_2940.child1.child0;
  local_558 = (proto_child0)local_2940.child1.child0;
  local_550 = (proto_child0)local_2940.child1.child0;
  local_548 = (proto_child0)local_2940.child1.child0;
  local_530 = (proto_child0)local_2940.child1.child0;
  local_528 = (proto_child0)local_2940.child1.child0;
  local_300 = (proto_child0)local_2990.child1.child0;
  local_2f8 = (proto_child0)local_2990.child1.child0;
  local_2e0 = (proto_child0)local_2990.child1.child0;
  local_2d0 = (proto_child0)local_2990.child1.child0;
  local_2c8 = (proto_child0)local_2990.child1.child0;
  local_2c0 = (proto_child0)local_2990.child1.child0;
  local_2a8 = (proto_child0)local_2990.child1.child0;
  local_2a0 = (proto_child0)local_2990.child1.child0;
  that_69.child0 = (proto_child0)local_2940.child1.child0;
  that_71.child0 = (proto_child0)local_2990.child1.child0;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->transitions_declaration,expr);
  tuple = &this->start_tag;
  boost::phoenix::at_c<0,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)expr,tuple_00);
  local_1c38 = local_29e5;
  that_84._8_8_ = &boost::spirit::_1;
  local_1120 = &boost::spirit::_1;
  local_1110 = &local_1121;
  local_1118 = &boost::spirit::_1;
  local_1102 = 0;
  ppVar2 = (phoenix *)&local_1c38;
  local_10c = 0;
  local_d8 = &local_10e;
  local_e8 = &local_10c;
  local_f0 = &local_10d;
  ppStack_108 = ppVar2;
  local_e0 = ppVar2;
  local_c8 = boost::proto::_::
             impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
             ::operator()(&local_f2,(expr_param)ppVar2,local_e8,local_f0);
  local_c0 = &local_f1;
  local_a8 = &local_c9;
  local_b0 = local_cc;
  a1 = (proto_child0)local_29e3;
  local_118 = &local_139;
  local_128 = &local_1c79;
  local_130 = &paStack_1c78;
  local_29e3._3_8_ = tuple;
  local_29d8 = a1;
  paStack_1c78 = (actor<boost::spirit::attribute<0>_> *)tuple;
  that_87.child1 = (proto_child1)a1;
  local_138 = a1;
  local_120 = a1;
  local_b8 = local_c8;
  pbStack_98 = local_c8;
  that_87.child0 = a1;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar2,(actor<boost::spirit::attribute<0>_> *)tuple);
  ppVar2 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_2a0e,(adl_barrier *)&boost::spirit::_1,a0,
             (actor<boost::spirit::argument<0>_> *)a1);
  local_2a00 = (proto_child0)(local_2a0e + 2);
  local_10 = &local_31;
  local_20 = &local_1bf9;
  local_28 = &prStack_1bf8;
  local_29f8[0] = &local_2a08;
  local_29d0.child0 = (proto_child0)(local_29e3 + 3);
  local_29d0.child1 = (proto_child1)local_29f8;
  local_2a08 = &this->node;
  prStack_1bf8 = &this->node;
  that_88.child1 = (proto_child1)local_2a00;
  local_30 = local_2a00;
  local_18 = local_2a00;
  that_88.child0 = local_2a00;
  boost::phoenix::at_c<0,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar2,
             (actor<boost::spirit::attribute<0>_> *)local_29d0.child0);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void(std::__cxx11::string),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator()(&local_2a28,
               (rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void(std::__cxx11::string),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
                *)&this->end_tag,&local_2a2a);
  local_29c0.child0 = &local_29d0;
  local_29c0.child1 = &local_2a28;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::operator=<_272831df_>(&this->xml,&local_29c0);
  return;
}

Assistant:

mini_xml_grammar() : mini_xml_grammar::base_type(xml)
        {
            using qi::lit;
            using qi::lexeme;
            using ascii::char_;
            using ascii::string;
            using namespace qi::labels;

            using phoenix::at_c;
            using phoenix::push_back;

            auto transitions_from_print = [](const std::string& s) {std::cout << "transitions_from: '" << s  << "'" << std::endl; };
            auto switch_to_print = [](const std::string& s) {std::cout << "switch_to: '" << s  << "'" << std::endl; };
            auto when_print = [](const std::string& s) {std::cout << "when: '" << s  << "'" << std::endl; };

            text = lexeme[+(char_ - '<')        [_val += _1]];
            node = (xml | text)                 [_val = _1];

            transitions_from =
                *(char_ - 't')
                >> lit("transitions_from")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            switch_to =
                   lit("switch_to")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            when =
                   lit("when")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            start_tag =
                    '<'
                >>  !lit('/')
                >>  lexeme[+(char_ - '>')       [_val += _1]]
                >>  '>'
            ;

            end_tag =
                    "</"
                >>  string(_r1)
                >>  '>'
            ;

            transitions_declaration =
                    transitions_from[transitions_from_print]
                >>  *( '.' >> switch_to[switch_to_print] >> '.' >> when[when_print])
                >>  ';'
            ;

//            xml =
//                    transitions_declaration
//                    >> '}'


            xml =
                start_tag                 [at_c<0>(_val) = _1]
                >>  *node                 [push_back(at_c<1>(_val), _1)]
                >>  end_tag(at_c<0>(_val))
            ;
//            xml =
//                    start_tag                   [at_c<0>(_val) = _1]
//                >>  *node                       [push_back(at_c<1>(_val), _1)]
//                >>  end_tag(at_c<0>(_val))
//            ;
        }